

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

Bool SetOptionValue(TidyDocImpl *doc,TidyOptionId optId,ctmbstr val)

{
  ctmbstr ptVar1;
  int iVar2;
  uint uVar3;
  Bool BVar4;
  TidyConfigChangeCallback UNRECOVERED_JUMPTABLE;
  bool bVar5;
  
  if (optId < N_TIDY_OPTIONS) {
    if ((option_defs[optId].id != optId) || (option_defs[optId].type != TidyString)) {
      __assert_fail("option->id == optId && option->type == TidyString",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/config.c"
                    ,0x1a9,"Bool SetOptionValue(TidyDocImpl *, TidyOptionId, ctmbstr)");
    }
    bVar5 = true;
    if ((doc->pConfigChangeCallback != (TidyConfigChangeCallback)0x0) &&
       (ptVar1 = (doc->config).value[optId].p, ptVar1 != val)) {
      if (val == (ctmbstr)0x0 || ptVar1 == (ctmbstr)0x0) {
        bVar5 = false;
      }
      else {
        iVar2 = prvTidytmbstrcmp(ptVar1,val);
        bVar5 = iVar2 == 0;
      }
    }
    ptVar1 = (doc->config).value[optId].p;
    if ((ptVar1 != (ctmbstr)0x0) && (ptVar1 != option_defs[optId].pdflt)) {
      (*doc->allocator->vtbl->free)(doc->allocator,ptVar1);
    }
    uVar3 = prvTidytmbstrlen(val);
    if (uVar3 == 0) {
      UNRECOVERED_JUMPTABLE = (TidyConfigChangeCallback)0x0;
    }
    else {
      UNRECOVERED_JUMPTABLE = (TidyConfigChangeCallback)prvTidytmbstrdup(doc->allocator,val);
    }
    (doc->config).value[optId].v = (ulong)UNRECOVERED_JUMPTABLE;
    if ((!bVar5) &&
       (UNRECOVERED_JUMPTABLE = doc->pConfigChangeCallback,
       UNRECOVERED_JUMPTABLE != (TidyConfigChangeCallback)0x0)) {
      BVar4 = (*UNRECOVERED_JUMPTABLE)((TidyDoc)doc,(TidyOption)(option_defs + optId));
      return BVar4;
    }
  }
  return (Bool)UNRECOVERED_JUMPTABLE;
}

Assistant:

static Bool SetOptionValue( TidyDocImpl* doc, TidyOptionId optId, ctmbstr val )
{
    const TidyOptionImpl* option = &option_defs[ optId ];
    Bool fire_callback = no;
    Bool status = ( optId < N_TIDY_OPTIONS );

    if ( status )
    {
        assert( option->id == optId && option->type == TidyString );

        /* Compare the old and new values. */
        if ( doc->pConfigChangeCallback )
        {
            TidyOptionValue* oldval = &(doc->config.value[ optId ]);
            fire_callback = OptionChangedValuesDiffer( oldval->p, val );
        }

        FreeOptionValue( doc, option, &doc->config.value[ optId ] );
        if ( TY_(tmbstrlen)(val)) /* Issue #218 - ONLY if it has LENGTH! */
            doc->config.value[ optId ].p = TY_(tmbstrdup)( doc->allocator, val );
        else
            doc->config.value[ optId ].p = 0; /* should already be zero, but to be sure... */
    }

    if ( fire_callback )
        PerformOptionChangedCallback( doc, option );

    return status;
}